

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O0

void __thiscall
HashtableAllTest_FindAndCountAndEqualRange_Test<google::HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
::TestBody(HashtableAllTest_FindAndCountAndEqualRange_Test<google::HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  iterator it_00;
  bool bVar1;
  key_type *key;
  BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  *this_00;
  AssertHelper *this_01;
  char *expression_text;
  AssertionResult *assertion_result;
  char *actual_predicate_value;
  BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  *this_02;
  AssertHelper *this_03;
  char *pcVar2;
  key_type file;
  long in_RDI;
  AssertionResult gtest_ar__23;
  AssertionResult gtest_ar_14;
  AssertionResult gtest_ar__22;
  AssertionResult gtest_ar__21;
  AssertionResult gtest_ar_13;
  AssertionResult gtest_ar__20;
  AssertionResult gtest_ar__19;
  AssertionResult gtest_ar_12;
  AssertionResult gtest_ar__18;
  AssertionResult gtest_ar__17;
  AssertionResult gtest_ar_11;
  AssertionResult gtest_ar__16;
  AssertionResult gtest_ar__15;
  AssertionResult gtest_ar_10;
  AssertionResult gtest_ar__14;
  AssertionResult gtest_ar_9;
  AssertionResult gtest_ar__13;
  AssertionResult gtest_ar__12;
  AssertionResult gtest_ar_8;
  AssertionResult gtest_ar__11;
  AssertionResult gtest_ar_7;
  AssertionResult gtest_ar__10;
  AssertionResult gtest_ar__9;
  AssertionResult gtest_ar_6;
  AssertionResult gtest_ar__8;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar__7;
  AssertionResult gtest_ar__6;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar__5;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar__4;
  TypeParam ht;
  AssertionResult gtest_ar_2;
  const_iterator it;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar__3;
  AssertionResult gtest_ar__2;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar_;
  pair<google::BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>::const_iterator,_google::BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>::const_iterator>
  const_eq_pair;
  pair<google::BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_google::BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>::iterator>
  eq_pair;
  undefined4 in_stack_ffffffffffffeb18;
  undefined4 uVar3;
  int in_stack_ffffffffffffeb1c;
  undefined4 uVar4;
  HashtableTest<google::HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_ffffffffffffeb20;
  BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  *this_04;
  undefined4 in_stack_ffffffffffffeb28;
  undefined4 uVar5;
  int in_stack_ffffffffffffeb2c;
  int iVar6;
  HashtableTest<google::HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_ffffffffffffeb30;
  HashtableTest<google::HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  *this_05;
  char *in_stack_ffffffffffffeb38;
  int line;
  pair<google::BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>::const_iterator,_google::BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>::const_iterator>
  *this_06;
  char *in_stack_ffffffffffffeb40;
  undefined8 in_stack_ffffffffffffeb48;
  Type type;
  AssertHelper *in_stack_ffffffffffffeb50;
  key_type *in_stack_ffffffffffffeb58;
  BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_ffffffffffffeb60;
  char *in_stack_ffffffffffffeb80;
  char *in_stack_ffffffffffffeb88;
  char *in_stack_ffffffffffffeb90;
  AssertionResult *in_stack_ffffffffffffeb98;
  BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_ffffffffffffeba0;
  key_type *in_stack_ffffffffffffebe8;
  BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_ffffffffffffebf0;
  string local_1200 [55];
  undefined1 local_11c9;
  AssertionResult local_11c8;
  key_type local_11b8;
  pair<google::BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>::const_iterator,_google::BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>::const_iterator>
  local_11b0;
  key_type local_1160;
  AssertHelper *local_1158;
  undefined4 local_114c;
  AssertionResult local_1148;
  string local_1138 [48];
  const_iterator local_1108;
  BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  *local_10e8;
  dense_hashtable_const_iterator<const_char_*,_const_char_*,_Hasher,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  local_10e0;
  undefined1 local_10b9;
  AssertionResult local_10b8;
  string local_10a8 [55];
  undefined1 local_1071;
  AssertionResult local_1070;
  key_type local_1060;
  pair<google::BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_google::BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>::iterator>
  local_1058;
  AssertionResult *local_1008;
  char *local_1000;
  undefined4 local_ff4;
  AssertionResult local_ff0;
  string local_fe0 [48];
  const_iterator local_fb0;
  key_type local_f90;
  dense_hashtable_const_iterator<const_char_*,_const_char_*,_Hasher,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  local_f88;
  undefined1 local_f61;
  AssertionResult local_f60;
  string local_f50 [55];
  undefined1 local_f19;
  AssertionResult local_f18;
  key_type local_f08;
  pair<google::BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>::const_iterator,_google::BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>::const_iterator>
  local_f00;
  key_type local_eb0;
  size_type local_ea8;
  undefined4 local_e9c;
  AssertionResult local_e98;
  string local_e88 [48];
  const_iterator local_e58;
  key_type local_e38;
  dense_hashtable_const_iterator<const_char_*,_const_char_*,_Hasher,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  local_e30;
  undefined1 local_e09;
  AssertionResult local_e08;
  string local_df8 [55];
  undefined1 local_dc1;
  AssertionResult local_dc0;
  BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  *local_db0;
  pair<google::BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_google::BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>::iterator>
  local_da8;
  key_type local_d58;
  size_type local_d50;
  undefined4 local_d44;
  AssertionResult local_d40;
  string local_d30 [48];
  const_iterator local_d00;
  key_type local_ce0;
  dense_hashtable_const_iterator<const_char_*,_const_char_*,_Hasher,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  local_cd8;
  undefined1 local_cb1;
  AssertionResult local_cb0;
  string local_ca0 [55];
  undefined1 local_c69;
  AssertionResult local_c68 [2];
  key_type local_c48;
  key_type local_c40;
  AssertionResult local_c38;
  string local_c28 [55];
  undefined1 local_bf1;
  AssertionResult local_bf0;
  key_type local_be0;
  pair<google::BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>::const_iterator,_google::BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>::const_iterator>
  local_bd8;
  key_type local_b88;
  size_type local_b80;
  undefined4 local_b74;
  AssertionResult local_b70;
  string local_b60 [48];
  const_iterator local_b30;
  key_type local_b10;
  dense_hashtable_const_iterator<const_char_*,_const_char_*,_Hasher,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  local_b08;
  undefined1 local_ae1;
  AssertionResult local_ae0;
  string local_ad0 [55];
  undefined1 local_a99;
  AssertionResult local_a98 [2];
  key_type local_a78;
  key_type local_a70;
  AssertionResult local_a68;
  string local_a58 [55];
  undefined1 local_a21;
  AssertionResult local_a20;
  key_type local_a10;
  pair<google::BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_google::BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>::iterator>
  local_a08;
  key_type local_9b8;
  size_type local_9b0;
  undefined4 local_9a4;
  AssertionResult local_9a0;
  string local_990 [48];
  const_iterator local_960;
  key_type local_940;
  dense_hashtable_const_iterator<const_char_*,_const_char_*,_Hasher,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  local_938;
  undefined1 local_911;
  AssertionResult local_910;
  string local_900 [55];
  undefined1 local_8c9;
  AssertionResult local_8c8 [2];
  key_type local_8a8;
  key_type local_8a0;
  AssertionResult local_898;
  string local_888 [55];
  undefined1 local_851;
  AssertionResult local_850;
  key_type local_840;
  pair<google::BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>::const_iterator,_google::BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>::const_iterator>
  local_838;
  key_type local_7e8;
  size_type local_7e0;
  undefined4 local_7d4;
  AssertionResult local_7d0;
  string local_7c0 [48];
  const_iterator local_790;
  key_type local_770;
  dense_hashtable_const_iterator<const_char_*,_const_char_*,_Hasher,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  local_768;
  undefined1 local_741;
  AssertionResult local_740;
  string local_730 [55];
  undefined1 local_6f9;
  AssertionResult local_6f8 [2];
  key_type local_6d8;
  key_type local_6d0;
  AssertionResult local_6c8;
  string local_6b8 [55];
  undefined1 local_681;
  AssertionResult local_680;
  key_type local_670;
  pair<google::BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_google::BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>::iterator>
  local_668;
  key_type local_618;
  size_type local_610;
  undefined4 local_604;
  AssertionResult local_600;
  string local_5f0 [48];
  const_iterator local_5c0;
  key_type local_5a0;
  dense_hashtable_const_iterator<const_char_*,_const_char_*,_Hasher,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  local_598;
  undefined1 local_571;
  AssertionResult local_570 [10];
  key_type local_4c8;
  key_type local_4c0;
  AssertionResult local_4b8;
  key_type local_4a8;
  undefined8 local_4a0;
  BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  *local_498;
  undefined8 local_490;
  HashtableTest<google::HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  *local_488;
  const_iterator local_480;
  size_type local_450;
  undefined4 local_444;
  AssertionResult local_440 [3];
  value_type local_408;
  value_type local_3d8;
  value_type local_3a8;
  value_type local_378;
  value_type local_348;
  value_type local_318;
  value_type local_2e8;
  value_type local_2b8;
  string local_2b0 [55];
  byte local_279;
  AssertionResult local_278 [3];
  value_type local_240;
  string local_238 [55];
  undefined1 local_201;
  AssertionResult local_200;
  key_type local_1f0;
  pair<google::BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_google::BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>::iterator>
  local_1e8;
  key_type local_198;
  size_type local_190;
  undefined4 local_184;
  AssertionResult local_180;
  string local_170 [48];
  const_iterator local_140;
  key_type local_120;
  dense_hashtable_const_iterator<const_char_*,_const_char_*,_Hasher,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  local_118;
  undefined1 local_f1;
  AssertionResult local_f0;
  string local_e0 [71];
  undefined1 local_99;
  AssertionResult local_98;
  pair<google::BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>::const_iterator,_google::BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>::const_iterator>
  local_88;
  pair<google::BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_google::BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>::iterator>
  local_48;
  
  type = (Type)((ulong)in_stack_ffffffffffffeb48 >> 0x20);
  std::
  pair<google::BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_google::BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>::iterator>
  ::
  pair<google::BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_google::BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_true>
            ((pair<google::BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_google::BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>::iterator>
              *)in_stack_ffffffffffffeb20);
  std::
  pair<google::BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>::const_iterator,_google::BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>::const_iterator>
  ::
  pair<google::BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>::const_iterator,_google::BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>::const_iterator,_true>
            ((pair<google::BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>::const_iterator,_google::BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>::const_iterator>
              *)in_stack_ffffffffffffeb20);
  local_99 = google::
             BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
             ::empty((BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                      *)0xd793ba);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)in_stack_ffffffffffffeb20,
             (bool *)CONCAT44(in_stack_ffffffffffffeb1c,in_stack_ffffffffffffeb18),(type *)0xd793dc)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_98);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffeb50);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_ffffffffffffeb98,in_stack_ffffffffffffeb90,in_stack_ffffffffffffeb88,
               in_stack_ffffffffffffeb80);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffeb50,type,in_stack_ffffffffffffeb40,
               (int)((ulong)in_stack_ffffffffffffeb38 >> 0x20),(char *)in_stack_ffffffffffffeb30);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_ffffffffffffeba0,(Message *)in_stack_ffffffffffffeb98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffeb20);
    std::__cxx11::string::~string(local_e0);
    testing::Message::~Message((Message *)0xd7949d);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd79534);
  local_120 = HashtableTest<google::HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey(in_stack_ffffffffffffeb30,in_stack_ffffffffffffeb2c);
  google::
  BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::find(in_stack_ffffffffffffeb60,in_stack_ffffffffffffeb58);
  google::
  BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::end(in_stack_ffffffffffffeb60);
  local_f1 = google::
             dense_hashtable_const_iterator<const_char_*,_const_char_*,_Hasher,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
             ::operator==(&local_118,&local_140);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)in_stack_ffffffffffffeb20,
             (bool *)CONCAT44(in_stack_ffffffffffffeb1c,in_stack_ffffffffffffeb18),(type *)0xd795ca)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_f0);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffeb50);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_ffffffffffffeb98,in_stack_ffffffffffffeb90,in_stack_ffffffffffffeb88,
               in_stack_ffffffffffffeb80);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffeb50,type,in_stack_ffffffffffffeb40,
               (int)((ulong)in_stack_ffffffffffffeb38 >> 0x20),(char *)in_stack_ffffffffffffeb30);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_ffffffffffffeba0,(Message *)in_stack_ffffffffffffeb98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffeb20);
    std::__cxx11::string::~string(local_170);
    testing::Message::~Message((Message *)0xd7969d);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd79734);
  local_184 = 0;
  local_198 = HashtableTest<google::HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey(in_stack_ffffffffffffeb30,in_stack_ffffffffffffeb2c);
  local_190 = google::
              BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::count((BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                       *)in_stack_ffffffffffffeb20,
                      (key_type *)CONCAT44(in_stack_ffffffffffffeb1c,in_stack_ffffffffffffeb18));
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            (in_stack_ffffffffffffeb38,(char *)in_stack_ffffffffffffeb30,
             (uint *)CONCAT44(in_stack_ffffffffffffeb2c,in_stack_ffffffffffffeb28),
             (unsigned_long *)in_stack_ffffffffffffeb20);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_180);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffeb50);
    testing::AssertionResult::failure_message((AssertionResult *)0xd797f6);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffeb50,type,in_stack_ffffffffffffeb40,
               (int)((ulong)in_stack_ffffffffffffeb38 >> 0x20),(char *)in_stack_ffffffffffffeb30);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_ffffffffffffeba0,(Message *)in_stack_ffffffffffffeb98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffeb20);
    testing::Message::~Message((Message *)0xd79859);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd798ca);
  local_1f0 = HashtableTest<google::HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey(in_stack_ffffffffffffeb30,in_stack_ffffffffffffeb2c);
  google::
  BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::equal_range(in_stack_ffffffffffffebf0,in_stack_ffffffffffffebe8);
  std::
  pair<google::BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_google::BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>::iterator>
  ::operator=(&local_48,&local_1e8);
  local_201 = google::
              dense_hashtable_const_iterator<const_char_*,_const_char_*,_Hasher,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
              ::operator==((dense_hashtable_const_iterator<const_char_*,_const_char_*,_Hasher,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
                            *)&local_48,&local_48.second.super_iterator);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)in_stack_ffffffffffffeb20,
             (bool *)CONCAT44(in_stack_ffffffffffffeb1c,in_stack_ffffffffffffeb18),(type *)0xd79960)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_200);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffeb50);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_ffffffffffffeb98,in_stack_ffffffffffffeb90,in_stack_ffffffffffffeb88,
               in_stack_ffffffffffffeb80);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffeb50,type,in_stack_ffffffffffffeb40,
               (int)((ulong)in_stack_ffffffffffffeb38 >> 0x20),(char *)in_stack_ffffffffffffeb30);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_ffffffffffffeba0,(Message *)in_stack_ffffffffffffeb98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffeb20);
    std::__cxx11::string::~string(local_238);
    testing::Message::~Message((Message *)0xd79a33);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd79aca);
  local_240 = HashtableTest<google::HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueObject(in_stack_ffffffffffffeb20,in_stack_ffffffffffffeb1c);
  google::
  BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(in_stack_ffffffffffffeba0,(value_type *)in_stack_ffffffffffffeb98);
  bVar1 = google::
          BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
          ::empty((BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                   *)0xd79b21);
  local_279 = (bVar1 ^ 0xffU) & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)in_stack_ffffffffffffeb20,
             (bool *)CONCAT44(in_stack_ffffffffffffeb1c,in_stack_ffffffffffffeb18),(type *)0xd79b45)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_278);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffeb50);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_ffffffffffffeb98,in_stack_ffffffffffffeb90,in_stack_ffffffffffffeb88,
               in_stack_ffffffffffffeb80);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffeb50,type,in_stack_ffffffffffffeb40,
               (int)((ulong)in_stack_ffffffffffffeb38 >> 0x20),(char *)in_stack_ffffffffffffeb30);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_ffffffffffffeba0,(Message *)in_stack_ffffffffffffeb98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffeb20);
    std::__cxx11::string::~string(local_2b0);
    testing::Message::~Message((Message *)0xd79c18);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd79caf);
  local_2b8 = HashtableTest<google::HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueObject(in_stack_ffffffffffffeb20,in_stack_ffffffffffffeb1c);
  google::
  BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(in_stack_ffffffffffffeba0,(value_type *)in_stack_ffffffffffffeb98);
  local_2e8 = HashtableTest<google::HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueObject(in_stack_ffffffffffffeb20,in_stack_ffffffffffffeb1c);
  google::
  BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(in_stack_ffffffffffffeba0,(value_type *)in_stack_ffffffffffffeb98);
  local_318 = HashtableTest<google::HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueObject(in_stack_ffffffffffffeb20,in_stack_ffffffffffffeb1c);
  google::
  BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(in_stack_ffffffffffffeba0,(value_type *)in_stack_ffffffffffffeb98);
  local_348 = HashtableTest<google::HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueObject(in_stack_ffffffffffffeb20,in_stack_ffffffffffffeb1c);
  google::
  BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(in_stack_ffffffffffffeba0,(value_type *)in_stack_ffffffffffffeb98);
  local_378 = HashtableTest<google::HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueObject(in_stack_ffffffffffffeb20,in_stack_ffffffffffffeb1c);
  google::
  BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(in_stack_ffffffffffffeba0,(value_type *)in_stack_ffffffffffffeb98);
  local_3a8 = HashtableTest<google::HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueObject(in_stack_ffffffffffffeb20,in_stack_ffffffffffffeb1c);
  google::
  BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(in_stack_ffffffffffffeba0,(value_type *)in_stack_ffffffffffffeb98);
  local_3d8 = HashtableTest<google::HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueObject(in_stack_ffffffffffffeb20,in_stack_ffffffffffffeb1c);
  google::
  BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(in_stack_ffffffffffffeba0,(value_type *)in_stack_ffffffffffffeb98);
  local_408 = HashtableTest<google::HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueObject(in_stack_ffffffffffffeb20,in_stack_ffffffffffffeb1c);
  google::
  BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(in_stack_ffffffffffffeba0,(value_type *)in_stack_ffffffffffffeb98);
  local_444 = 9;
  local_450 = google::
              BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::size((BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                      *)0xd79efb);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            (in_stack_ffffffffffffeb38,(char *)in_stack_ffffffffffffeb30,
             (uint *)CONCAT44(in_stack_ffffffffffffeb2c,in_stack_ffffffffffffeb28),
             (unsigned_long *)in_stack_ffffffffffffeb20);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_440);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffeb50);
    testing::AssertionResult::failure_message((AssertionResult *)0xd79f74);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffeb50,type,in_stack_ffffffffffffeb40,
               (int)((ulong)in_stack_ffffffffffffeb38 >> 0x20),(char *)in_stack_ffffffffffffeb30);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_ffffffffffffeba0,(Message *)in_stack_ffffffffffffeb98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffeb20);
    testing::Message::~Message((Message *)0xd79fd7);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd7a048);
  local_4a8 = HashtableTest<google::HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey(in_stack_ffffffffffffeb30,in_stack_ffffffffffffeb2c);
  google::
  BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::find(in_stack_ffffffffffffeb60,in_stack_ffffffffffffeb58);
  uVar3 = (undefined4)local_4a0;
  uVar4 = (undefined4)((ulong)local_4a0 >> 0x20);
  uVar5 = (undefined4)local_490;
  iVar6 = (int)((ulong)local_490 >> 0x20);
  it_00.super_iterator.pos = (pointer)local_498;
  it_00.super_iterator.ht =
       (dense_hashtable<const_char_*,_const_char_*,_Hasher,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
        *)local_4a0;
  it_00.super_iterator.end._0_4_ = uVar5;
  it_00.super_iterator.end._4_4_ = iVar6;
  it_00.parent_ =
       (BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
        *)local_488;
  google::
  BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::const_iterator::const_iterator(&local_480,it_00);
  local_4c0 = google::
              BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::const_iterator::key((const_iterator *)0xd7a0d2);
  local_4c8 = HashtableTest<google::HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey(local_488,iVar6);
  testing::internal::EqHelper::Compare<const_char_*,_const_char_*,_nullptr>
            (in_stack_ffffffffffffeb38,(char *)local_488,(char **)CONCAT44(iVar6,uVar5),
             (char **)local_498);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_4b8);
  this_04 = local_498;
  this_05 = local_488;
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffeb50);
    testing::AssertionResult::failure_message((AssertionResult *)0xd7a165);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffeb50,type,in_stack_ffffffffffffeb40,
               (int)((ulong)in_stack_ffffffffffffeb38 >> 0x20),(char *)local_488);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_ffffffffffffeba0,(Message *)in_stack_ffffffffffffeb98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_498);
    testing::Message::~Message((Message *)0xd7a1c8);
    this_04 = local_498;
    this_05 = local_488;
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd7a239);
  google::
  HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  ::HashtableInterface_DenseHashSet
            ((HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
              *)this_04,
             (HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
              *)CONCAT44(uVar4,uVar3));
  local_5a0 = HashtableTest<google::HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey(this_05,iVar6);
  google::
  BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::find(in_stack_ffffffffffffeb60,in_stack_ffffffffffffeb58);
  google::
  BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::end(in_stack_ffffffffffffeb60);
  local_571 = google::
              dense_hashtable_const_iterator<const_char_*,_const_char_*,_Hasher,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
              ::operator!=(&local_598,&local_5c0);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)this_04,(bool *)CONCAT44(uVar4,uVar3),(type *)0xd7a2f5);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_570);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffeb50);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_ffffffffffffeb98,in_stack_ffffffffffffeb90,in_stack_ffffffffffffeb88,
               in_stack_ffffffffffffeb80);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffeb50,type,in_stack_ffffffffffffeb40,
               (int)((ulong)in_stack_ffffffffffffeb38 >> 0x20),(char *)this_05);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_ffffffffffffeba0,(Message *)in_stack_ffffffffffffeb98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_04);
    std::__cxx11::string::~string(local_5f0);
    testing::Message::~Message((Message *)0xd7a3e3);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd7a47a);
  local_604 = 1;
  local_618 = HashtableTest<google::HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey(this_05,iVar6);
  local_610 = google::
              BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::count(this_04,(key_type *)CONCAT44(uVar4,uVar3));
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            (in_stack_ffffffffffffeb38,(char *)this_05,(uint *)CONCAT44(iVar6,uVar5),
             (unsigned_long *)this_04);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_600);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffeb50);
    testing::AssertionResult::failure_message((AssertionResult *)0xd7a562);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffeb50,type,in_stack_ffffffffffffeb40,
               (int)((ulong)in_stack_ffffffffffffeb38 >> 0x20),(char *)this_05);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_ffffffffffffeba0,(Message *)in_stack_ffffffffffffeb98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_04);
    testing::Message::~Message((Message *)0xd7a5c5);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd7a636);
  local_670 = HashtableTest<google::HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey(this_05,iVar6);
  google::
  BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::equal_range(in_stack_ffffffffffffebf0,in_stack_ffffffffffffebe8);
  std::
  pair<google::BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_google::BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>::iterator>
  ::operator=(&local_48,&local_668);
  local_681 = google::
              dense_hashtable_const_iterator<const_char_*,_const_char_*,_Hasher,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
              ::operator!=((dense_hashtable_const_iterator<const_char_*,_const_char_*,_Hasher,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
                            *)&local_48,&local_48.second.super_iterator);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)this_04,(bool *)CONCAT44(uVar4,uVar3),(type *)0xd7a6e2);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_680);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffeb50);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_ffffffffffffeb98,in_stack_ffffffffffffeb90,in_stack_ffffffffffffeb88,
               in_stack_ffffffffffffeb80);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffeb50,type,in_stack_ffffffffffffeb40,
               (int)((ulong)in_stack_ffffffffffffeb38 >> 0x20),(char *)this_05);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_ffffffffffffeba0,(Message *)in_stack_ffffffffffffeb98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_04);
    std::__cxx11::string::~string(local_6b8);
    testing::Message::~Message((Message *)0xd7a7b7);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd7a84e);
  local_6d0 = google::
              BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::iterator::key((iterator *)0xd7a85b);
  local_6d8 = HashtableTest<google::HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey(this_05,iVar6);
  testing::internal::EqHelper::Compare<const_char_*,_const_char_*,_nullptr>
            (in_stack_ffffffffffffeb38,(char *)this_05,(char **)CONCAT44(iVar6,uVar5),
             (char **)this_04);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_6c8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffeb50);
    testing::AssertionResult::failure_message((AssertionResult *)0xd7a914);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffeb50,type,in_stack_ffffffffffffeb40,
               (int)((ulong)in_stack_ffffffffffffeb38 >> 0x20),(char *)this_05);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_ffffffffffffeba0,(Message *)in_stack_ffffffffffffeb98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_04);
    testing::Message::~Message((Message *)0xd7a977);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd7a9e5);
  google::
  dense_hashtable_const_iterator<const_char_*,_const_char_*,_Hasher,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  ::operator++((dense_hashtable_const_iterator<const_char_*,_const_char_*,_Hasher,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
                *)this_04);
  local_6f9 = google::
              dense_hashtable_const_iterator<const_char_*,_const_char_*,_Hasher,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
              ::operator==((dense_hashtable_const_iterator<const_char_*,_const_char_*,_Hasher,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
                            *)&local_48,&local_48.second.super_iterator);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)this_04,(bool *)CONCAT44(uVar4,uVar3),(type *)0xd7aa29);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_6f8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffeb50);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_ffffffffffffeb98,in_stack_ffffffffffffeb90,in_stack_ffffffffffffeb88,
               in_stack_ffffffffffffeb80);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffeb50,type,in_stack_ffffffffffffeb40,
               (int)((ulong)in_stack_ffffffffffffeb38 >> 0x20),(char *)this_05);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_ffffffffffffeba0,(Message *)in_stack_ffffffffffffeb98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_04);
    std::__cxx11::string::~string(local_730);
    testing::Message::~Message((Message *)0xd7aafe);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd7ab95);
  local_770 = HashtableTest<google::HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey(this_05,iVar6);
  google::
  BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::find(in_stack_ffffffffffffeb60,in_stack_ffffffffffffeb58);
  google::
  BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::end(in_stack_ffffffffffffeb60);
  local_741 = google::
              dense_hashtable_const_iterator<const_char_*,_const_char_*,_Hasher,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
              ::operator!=(&local_768,&local_790);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)this_04,(bool *)CONCAT44(uVar4,uVar3),(type *)0xd7ac2c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_740);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffeb50);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_ffffffffffffeb98,in_stack_ffffffffffffeb90,in_stack_ffffffffffffeb88,
               in_stack_ffffffffffffeb80);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffeb50,type,in_stack_ffffffffffffeb40,
               (int)((ulong)in_stack_ffffffffffffeb38 >> 0x20),(char *)this_05);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_ffffffffffffeba0,(Message *)in_stack_ffffffffffffeb98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_04);
    std::__cxx11::string::~string(local_7c0);
    testing::Message::~Message((Message *)0xd7ad01);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd7ad98);
  local_7d4 = 1;
  local_7e8 = HashtableTest<google::HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey(this_05,iVar6);
  local_7e0 = google::
              BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::count(this_04,(key_type *)CONCAT44(uVar4,uVar3));
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            (in_stack_ffffffffffffeb38,(char *)this_05,(uint *)CONCAT44(iVar6,uVar5),
             (unsigned_long *)this_04);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_7d0);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffeb50);
    testing::AssertionResult::failure_message((AssertionResult *)0xd7ae71);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffeb50,type,in_stack_ffffffffffffeb40,
               (int)((ulong)in_stack_ffffffffffffeb38 >> 0x20),(char *)this_05);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_ffffffffffffeba0,(Message *)in_stack_ffffffffffffeb98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_04);
    testing::Message::~Message((Message *)0xd7aed4);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd7af45);
  local_840 = HashtableTest<google::HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey(this_05,iVar6);
  google::
  BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::equal_range(in_stack_ffffffffffffebf0,in_stack_ffffffffffffebe8);
  std::
  pair<google::BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>::const_iterator,_google::BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>::const_iterator>
  ::operator=(&local_88,&local_838);
  local_851 = google::
              dense_hashtable_const_iterator<const_char_*,_const_char_*,_Hasher,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
              ::operator!=((dense_hashtable_const_iterator<const_char_*,_const_char_*,_Hasher,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
                            *)&local_88,&local_88.second.super_const_iterator);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)this_04,(bool *)CONCAT44(uVar4,uVar3),(type *)0xd7afe2);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_850);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffeb50);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_ffffffffffffeb98,in_stack_ffffffffffffeb90,in_stack_ffffffffffffeb88,
               in_stack_ffffffffffffeb80);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffeb50,type,in_stack_ffffffffffffeb40,
               (int)((ulong)in_stack_ffffffffffffeb38 >> 0x20),(char *)this_05);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_ffffffffffffeba0,(Message *)in_stack_ffffffffffffeb98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_04);
    std::__cxx11::string::~string(local_888);
    testing::Message::~Message((Message *)0xd7b0b7);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd7b14e);
  local_8a0 = google::
              BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::const_iterator::key((const_iterator *)0xd7b15b);
  local_8a8 = HashtableTest<google::HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey(this_05,iVar6);
  testing::internal::EqHelper::Compare<const_char_*,_const_char_*,_nullptr>
            (in_stack_ffffffffffffeb38,(char *)this_05,(char **)CONCAT44(iVar6,uVar5),
             (char **)this_04);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_898);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffeb50);
    testing::AssertionResult::failure_message((AssertionResult *)0xd7b214);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffeb50,type,in_stack_ffffffffffffeb40,
               (int)((ulong)in_stack_ffffffffffffeb38 >> 0x20),(char *)this_05);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_ffffffffffffeba0,(Message *)in_stack_ffffffffffffeb98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_04);
    testing::Message::~Message((Message *)0xd7b277);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd7b2e5);
  google::
  dense_hashtable_const_iterator<const_char_*,_const_char_*,_Hasher,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  ::operator++((dense_hashtable_const_iterator<const_char_*,_const_char_*,_Hasher,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
                *)this_04);
  local_8c9 = google::
              dense_hashtable_const_iterator<const_char_*,_const_char_*,_Hasher,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
              ::operator==((dense_hashtable_const_iterator<const_char_*,_const_char_*,_Hasher,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
                            *)&local_88,&local_88.second.super_const_iterator);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)this_04,(bool *)CONCAT44(uVar4,uVar3),(type *)0xd7b329);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_8c8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffeb50);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_ffffffffffffeb98,in_stack_ffffffffffffeb90,in_stack_ffffffffffffeb88,
               in_stack_ffffffffffffeb80);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffeb50,type,in_stack_ffffffffffffeb40,
               (int)((ulong)in_stack_ffffffffffffeb38 >> 0x20),(char *)this_05);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_ffffffffffffeba0,(Message *)in_stack_ffffffffffffeb98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_04);
    std::__cxx11::string::~string(local_900);
    testing::Message::~Message((Message *)0xd7b3fe);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd7b495);
  local_940 = HashtableTest<google::HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey(this_05,iVar6);
  google::
  BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::find(in_stack_ffffffffffffeb60,in_stack_ffffffffffffeb58);
  google::
  BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::end(in_stack_ffffffffffffeb60);
  local_911 = google::
              dense_hashtable_const_iterator<const_char_*,_const_char_*,_Hasher,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
              ::operator!=(&local_938,&local_960);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)this_04,(bool *)CONCAT44(uVar4,uVar3),(type *)0xd7b53f);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_910);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffeb50);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_ffffffffffffeb98,in_stack_ffffffffffffeb90,in_stack_ffffffffffffeb88,
               in_stack_ffffffffffffeb80);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffeb50,type,in_stack_ffffffffffffeb40,
               (int)((ulong)in_stack_ffffffffffffeb38 >> 0x20),(char *)this_05);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_ffffffffffffeba0,(Message *)in_stack_ffffffffffffeb98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_04);
    std::__cxx11::string::~string(local_990);
    testing::Message::~Message((Message *)0xd7b614);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd7b6ab);
  local_9a4 = 1;
  local_9b8 = HashtableTest<google::HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey(this_05,iVar6);
  local_9b0 = google::
              BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::count(this_04,(key_type *)CONCAT44(uVar4,uVar3));
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            (in_stack_ffffffffffffeb38,(char *)this_05,(uint *)CONCAT44(iVar6,uVar5),
             (unsigned_long *)this_04);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_9a0);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffeb50);
    testing::AssertionResult::failure_message((AssertionResult *)0xd7b793);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffeb50,type,in_stack_ffffffffffffeb40,
               (int)((ulong)in_stack_ffffffffffffeb38 >> 0x20),(char *)this_05);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_ffffffffffffeba0,(Message *)in_stack_ffffffffffffeb98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_04);
    testing::Message::~Message((Message *)0xd7b7f6);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd7b867);
  local_a10 = HashtableTest<google::HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey(this_05,iVar6);
  google::
  BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::equal_range(in_stack_ffffffffffffebf0,in_stack_ffffffffffffebe8);
  std::
  pair<google::BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_google::BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>::iterator>
  ::operator=(&local_48,&local_a08);
  local_a21 = google::
              dense_hashtable_const_iterator<const_char_*,_const_char_*,_Hasher,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
              ::operator!=((dense_hashtable_const_iterator<const_char_*,_const_char_*,_Hasher,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
                            *)&local_48,&local_48.second.super_iterator);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)this_04,(bool *)CONCAT44(uVar4,uVar3),(type *)0xd7b913);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_a20);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffeb50);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_ffffffffffffeb98,in_stack_ffffffffffffeb90,in_stack_ffffffffffffeb88,
               in_stack_ffffffffffffeb80);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffeb50,type,in_stack_ffffffffffffeb40,
               (int)((ulong)in_stack_ffffffffffffeb38 >> 0x20),(char *)this_05);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_ffffffffffffeba0,(Message *)in_stack_ffffffffffffeb98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_04);
    std::__cxx11::string::~string(local_a58);
    testing::Message::~Message((Message *)0xd7b9e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd7ba7f);
  local_a70 = google::
              BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::iterator::key((iterator *)0xd7ba8c);
  local_a78 = HashtableTest<google::HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey(this_05,iVar6);
  testing::internal::EqHelper::Compare<const_char_*,_const_char_*,_nullptr>
            (in_stack_ffffffffffffeb38,(char *)this_05,(char **)CONCAT44(iVar6,uVar5),
             (char **)this_04);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_a68);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffeb50);
    testing::AssertionResult::failure_message((AssertionResult *)0xd7bb45);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffeb50,type,in_stack_ffffffffffffeb40,
               (int)((ulong)in_stack_ffffffffffffeb38 >> 0x20),(char *)this_05);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_ffffffffffffeba0,(Message *)in_stack_ffffffffffffeb98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_04);
    testing::Message::~Message((Message *)0xd7bba8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd7bc16);
  google::
  dense_hashtable_const_iterator<const_char_*,_const_char_*,_Hasher,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  ::operator++((dense_hashtable_const_iterator<const_char_*,_const_char_*,_Hasher,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
                *)this_04);
  local_a99 = google::
              dense_hashtable_const_iterator<const_char_*,_const_char_*,_Hasher,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
              ::operator==((dense_hashtable_const_iterator<const_char_*,_const_char_*,_Hasher,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
                            *)&local_48,&local_48.second.super_iterator);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)this_04,(bool *)CONCAT44(uVar4,uVar3),(type *)0xd7bc5a);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_a98);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffeb50);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_ffffffffffffeb98,in_stack_ffffffffffffeb90,in_stack_ffffffffffffeb88,
               in_stack_ffffffffffffeb80);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffeb50,type,in_stack_ffffffffffffeb40,
               (int)((ulong)in_stack_ffffffffffffeb38 >> 0x20),(char *)this_05);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_ffffffffffffeba0,(Message *)in_stack_ffffffffffffeb98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_04);
    std::__cxx11::string::~string(local_ad0);
    testing::Message::~Message((Message *)0xd7bd2f);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd7bdc6);
  local_b10 = HashtableTest<google::HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey(this_05,iVar6);
  google::
  BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::find(in_stack_ffffffffffffeb60,in_stack_ffffffffffffeb58);
  google::
  BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::end(in_stack_ffffffffffffeb60);
  local_ae1 = google::
              dense_hashtable_const_iterator<const_char_*,_const_char_*,_Hasher,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
              ::operator!=(&local_b08,&local_b30);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)this_04,(bool *)CONCAT44(uVar4,uVar3),(type *)0xd7be5d);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_ae0);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffeb50);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_ffffffffffffeb98,in_stack_ffffffffffffeb90,in_stack_ffffffffffffeb88,
               in_stack_ffffffffffffeb80);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffeb50,type,in_stack_ffffffffffffeb40,
               (int)((ulong)in_stack_ffffffffffffeb38 >> 0x20),(char *)this_05);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_ffffffffffffeba0,(Message *)in_stack_ffffffffffffeb98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_04);
    std::__cxx11::string::~string(local_b60);
    testing::Message::~Message((Message *)0xd7bf32);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd7bfc9);
  local_b74 = 1;
  local_b88 = HashtableTest<google::HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey(this_05,iVar6);
  local_b80 = google::
              BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::count(this_04,(key_type *)CONCAT44(uVar4,uVar3));
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            (in_stack_ffffffffffffeb38,(char *)this_05,(uint *)CONCAT44(iVar6,uVar5),
             (unsigned_long *)this_04);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_b70);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffeb50);
    testing::AssertionResult::failure_message((AssertionResult *)0xd7c0a2);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffeb50,type,in_stack_ffffffffffffeb40,
               (int)((ulong)in_stack_ffffffffffffeb38 >> 0x20),(char *)this_05);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_ffffffffffffeba0,(Message *)in_stack_ffffffffffffeb98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_04);
    testing::Message::~Message((Message *)0xd7c105);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd7c176);
  local_be0 = HashtableTest<google::HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey(this_05,iVar6);
  google::
  BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::equal_range(in_stack_ffffffffffffebf0,in_stack_ffffffffffffebe8);
  std::
  pair<google::BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>::const_iterator,_google::BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>::const_iterator>
  ::operator=(&local_88,&local_bd8);
  local_bf1 = google::
              dense_hashtable_const_iterator<const_char_*,_const_char_*,_Hasher,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
              ::operator!=((dense_hashtable_const_iterator<const_char_*,_const_char_*,_Hasher,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
                            *)&local_88,&local_88.second.super_const_iterator);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)this_04,(bool *)CONCAT44(uVar4,uVar3),(type *)0xd7c213);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_bf0);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffeb50);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_ffffffffffffeb98,in_stack_ffffffffffffeb90,in_stack_ffffffffffffeb88,
               in_stack_ffffffffffffeb80);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffeb50,type,in_stack_ffffffffffffeb40,
               (int)((ulong)in_stack_ffffffffffffeb38 >> 0x20),(char *)this_05);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_ffffffffffffeba0,(Message *)in_stack_ffffffffffffeb98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_04);
    std::__cxx11::string::~string(local_c28);
    testing::Message::~Message((Message *)0xd7c2e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd7c37f);
  local_c40 = google::
              BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::const_iterator::key((const_iterator *)0xd7c38c);
  local_c48 = HashtableTest<google::HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey(this_05,iVar6);
  testing::internal::EqHelper::Compare<const_char_*,_const_char_*,_nullptr>
            (in_stack_ffffffffffffeb38,(char *)this_05,(char **)CONCAT44(iVar6,uVar5),
             (char **)this_04);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_c38);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffeb50);
    testing::AssertionResult::failure_message((AssertionResult *)0xd7c445);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffeb50,type,in_stack_ffffffffffffeb40,
               (int)((ulong)in_stack_ffffffffffffeb38 >> 0x20),(char *)this_05);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_ffffffffffffeba0,(Message *)in_stack_ffffffffffffeb98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_04);
    testing::Message::~Message((Message *)0xd7c4a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd7c516);
  google::
  dense_hashtable_const_iterator<const_char_*,_const_char_*,_Hasher,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  ::operator++((dense_hashtable_const_iterator<const_char_*,_const_char_*,_Hasher,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
                *)this_04);
  local_c69 = google::
              dense_hashtable_const_iterator<const_char_*,_const_char_*,_Hasher,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
              ::operator==((dense_hashtable_const_iterator<const_char_*,_const_char_*,_Hasher,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
                            *)&local_88,&local_88.second.super_const_iterator);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)this_04,(bool *)CONCAT44(uVar4,uVar3),(type *)0xd7c55a);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_c68);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffeb50);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_ffffffffffffeb98,in_stack_ffffffffffffeb90,in_stack_ffffffffffffeb88,
               in_stack_ffffffffffffeb80);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffeb50,type,in_stack_ffffffffffffeb40,
               (int)((ulong)in_stack_ffffffffffffeb38 >> 0x20),(char *)this_05);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_ffffffffffffeba0,(Message *)in_stack_ffffffffffffeb98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_04);
    std::__cxx11::string::~string(local_ca0);
    testing::Message::~Message((Message *)0xd7c62f);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd7c6c6);
  local_ce0 = HashtableTest<google::HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey(this_05,iVar6);
  google::
  BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::find(in_stack_ffffffffffffeb60,in_stack_ffffffffffffeb58);
  google::
  BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::end(in_stack_ffffffffffffeb60);
  local_cb1 = google::
              dense_hashtable_const_iterator<const_char_*,_const_char_*,_Hasher,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
              ::operator==(&local_cd8,&local_d00);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)this_04,(bool *)CONCAT44(uVar4,uVar3),(type *)0xd7c770);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_cb0);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffeb50);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_ffffffffffffeb98,in_stack_ffffffffffffeb90,in_stack_ffffffffffffeb88,
               in_stack_ffffffffffffeb80);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffeb50,type,in_stack_ffffffffffffeb40,
               (int)((ulong)in_stack_ffffffffffffeb38 >> 0x20),(char *)this_05);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_ffffffffffffeba0,(Message *)in_stack_ffffffffffffeb98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_04);
    std::__cxx11::string::~string(local_d30);
    testing::Message::~Message((Message *)0xd7c845);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd7c8dc);
  local_d44 = 0;
  local_d58 = HashtableTest<google::HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey(this_05,iVar6);
  local_d50 = google::
              BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::count(this_04,(key_type *)CONCAT44(uVar4,uVar3));
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            (in_stack_ffffffffffffeb38,(char *)this_05,(uint *)CONCAT44(iVar6,uVar5),
             (unsigned_long *)this_04);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_d40);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffeb50);
    testing::AssertionResult::failure_message((AssertionResult *)0xd7c9c4);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffeb50,type,in_stack_ffffffffffffeb40,
               (int)((ulong)in_stack_ffffffffffffeb38 >> 0x20),(char *)this_05);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_ffffffffffffeba0,(Message *)in_stack_ffffffffffffeb98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_04);
    testing::Message::~Message((Message *)0xd7ca27);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd7ca98);
  key = (key_type *)(in_RDI + 0x10);
  this_00 = (BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
             *)HashtableTest<google::HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
               ::UniqueKey(this_05,iVar6);
  local_db0 = this_00;
  google::
  BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::equal_range(this_00,key);
  std::
  pair<google::BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_google::BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>::iterator>
  ::operator=(&local_48,&local_da8);
  local_dc1 = google::
              dense_hashtable_const_iterator<const_char_*,_const_char_*,_Hasher,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
              ::operator==((dense_hashtable_const_iterator<const_char_*,_const_char_*,_Hasher,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
                            *)&local_48,&local_48.second.super_iterator);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)this_04,(bool *)CONCAT44(uVar4,uVar3),(type *)0xd7cb44);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_dc0);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffeb50);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_ffffffffffffeb98,in_stack_ffffffffffffeb90,in_stack_ffffffffffffeb88,
               in_stack_ffffffffffffeb80);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffeb50,type,in_stack_ffffffffffffeb40,
               (int)((ulong)in_stack_ffffffffffffeb38 >> 0x20),(char *)this_05);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_ffffffffffffeba0,(Message *)in_stack_ffffffffffffeb98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_04);
    std::__cxx11::string::~string(local_df8);
    testing::Message::~Message((Message *)0xd7cc19);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd7ccb0);
  local_e38 = HashtableTest<google::HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey(this_05,iVar6);
  google::
  BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::find(in_stack_ffffffffffffeb60,in_stack_ffffffffffffeb58);
  google::
  BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::end(in_stack_ffffffffffffeb60);
  local_e09 = google::
              dense_hashtable_const_iterator<const_char_*,_const_char_*,_Hasher,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
              ::operator==(&local_e30,&local_e58);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)this_04,(bool *)CONCAT44(uVar4,uVar3),(type *)0xd7cd47);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_e08);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffeb50);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_ffffffffffffeb98,in_stack_ffffffffffffeb90,in_stack_ffffffffffffeb88,
               in_stack_ffffffffffffeb80);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffeb50,type,in_stack_ffffffffffffeb40,
               (int)((ulong)in_stack_ffffffffffffeb38 >> 0x20),(char *)this_05);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_ffffffffffffeba0,(Message *)in_stack_ffffffffffffeb98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_04);
    std::__cxx11::string::~string(local_e88);
    testing::Message::~Message((Message *)0xd7ce1c);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd7ceb3);
  local_e9c = 0;
  local_eb0 = HashtableTest<google::HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey(this_05,iVar6);
  local_ea8 = google::
              BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::count(this_04,(key_type *)CONCAT44(uVar4,uVar3));
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            (in_stack_ffffffffffffeb38,(char *)this_05,(uint *)CONCAT44(iVar6,uVar5),
             (unsigned_long *)this_04);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_e98);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffeb50);
    testing::AssertionResult::failure_message((AssertionResult *)0xd7cf8c);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffeb50,type,in_stack_ffffffffffffeb40,
               (int)((ulong)in_stack_ffffffffffffeb38 >> 0x20),(char *)this_05);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_ffffffffffffeba0,(Message *)in_stack_ffffffffffffeb98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_04);
    testing::Message::~Message((Message *)0xd7cfef);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd7d060);
  local_f08 = HashtableTest<google::HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey(this_05,iVar6);
  google::
  BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::equal_range(this_00,key);
  std::
  pair<google::BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>::const_iterator,_google::BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>::const_iterator>
  ::operator=(&local_88,&local_f00);
  local_f19 = google::
              dense_hashtable_const_iterator<const_char_*,_const_char_*,_Hasher,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
              ::operator==((dense_hashtable_const_iterator<const_char_*,_const_char_*,_Hasher,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
                            *)&local_88,&local_88.second.super_const_iterator);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)this_04,(bool *)CONCAT44(uVar4,uVar3),(type *)0xd7d0fd);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_f18);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffeb50);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_ffffffffffffeb98,in_stack_ffffffffffffeb90,in_stack_ffffffffffffeb88,
               in_stack_ffffffffffffeb80);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffeb50,type,in_stack_ffffffffffffeb40,
               (int)((ulong)in_stack_ffffffffffffeb38 >> 0x20),(char *)this_05);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_ffffffffffffeba0,(Message *)in_stack_ffffffffffffeb98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_04);
    std::__cxx11::string::~string(local_f50);
    testing::Message::~Message((Message *)0xd7d1d2);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd7d269);
  this_01 = (AssertHelper *)(in_RDI + 0x10);
  local_f90 = HashtableTest<google::HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey(this_05,iVar6);
  google::
  BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::find(in_stack_ffffffffffffeb60,in_stack_ffffffffffffeb58);
  google::
  BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::end(in_stack_ffffffffffffeb60);
  local_f61 = google::
              dense_hashtable_const_iterator<const_char_*,_const_char_*,_Hasher,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
              ::operator==(&local_f88,&local_fb0);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)this_04,(bool *)CONCAT44(uVar4,uVar3),(type *)0xd7d313);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_f60);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffeb50);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_ffffffffffffeb98,in_stack_ffffffffffffeb90,in_stack_ffffffffffffeb88,
               in_stack_ffffffffffffeb80);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffeb50,type,in_stack_ffffffffffffeb40,
               (int)((ulong)in_stack_ffffffffffffeb38 >> 0x20),(char *)this_05);
    testing::internal::AssertHelper::operator=(this_01,(Message *)in_stack_ffffffffffffeb98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_04);
    std::__cxx11::string::~string(local_fe0);
    testing::Message::~Message((Message *)0xd7d3e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd7d47f);
  local_ff4 = 0;
  expression_text = (char *)(in_RDI + 0x10);
  assertion_result =
       (AssertionResult *)
       HashtableTest<google::HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
       ::UniqueKey(this_05,iVar6);
  local_1008 = assertion_result;
  actual_predicate_value =
       (char *)google::
               BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
               ::count(this_04,(key_type *)CONCAT44(uVar4,uVar3));
  local_1000 = actual_predicate_value;
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            (in_stack_ffffffffffffeb38,(char *)this_05,(uint *)CONCAT44(iVar6,uVar5),
             (unsigned_long *)this_04);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_ff0);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffeb50);
    in_stack_ffffffffffffeb80 =
         testing::AssertionResult::failure_message((AssertionResult *)0xd7d55b);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffeb50,type,in_stack_ffffffffffffeb40,
               (int)((ulong)in_stack_ffffffffffffeb38 >> 0x20),(char *)this_05);
    testing::internal::AssertHelper::operator=(this_01,(Message *)assertion_result);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_04);
    testing::Message::~Message((Message *)0xd7d5b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd7d629);
  local_1060 = HashtableTest<google::HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
               ::UniqueKey(this_05,iVar6);
  google::
  BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::equal_range(this_00,key);
  std::
  pair<google::BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_google::BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>::iterator>
  ::operator=(&local_48,&local_1058);
  local_1071 = google::
               dense_hashtable_const_iterator<const_char_*,_const_char_*,_Hasher,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
               ::operator==((dense_hashtable_const_iterator<const_char_*,_const_char_*,_Hasher,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
                             *)&local_48,&local_48.second.super_iterator);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)this_04,(bool *)CONCAT44(uVar4,uVar3),(type *)0xd7d6c3);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1070);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffeb50);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (assertion_result,expression_text,actual_predicate_value,in_stack_ffffffffffffeb80);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffeb50,type,in_stack_ffffffffffffeb40,
               (int)((ulong)in_stack_ffffffffffffeb38 >> 0x20),(char *)this_05);
    testing::internal::AssertHelper::operator=(this_01,(Message *)assertion_result);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_04);
    std::__cxx11::string::~string(local_10a8);
    testing::Message::~Message((Message *)0xd7d798);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd7d82f);
  this_02 = (BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
             *)HashtableTest<google::HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
               ::UniqueKey(this_05,iVar6);
  local_10e8 = this_02;
  google::
  BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::find(this_02,in_stack_ffffffffffffeb58);
  google::
  BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::end(this_02);
  local_10b9 = google::
               dense_hashtable_const_iterator<const_char_*,_const_char_*,_Hasher,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
               ::operator==(&local_10e0,&local_1108);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)this_04,(bool *)CONCAT44(uVar4,uVar3),(type *)0xd7d8c0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_10b8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffeb50);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (assertion_result,expression_text,actual_predicate_value,in_stack_ffffffffffffeb80);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffeb50,type,in_stack_ffffffffffffeb40,
               (int)((ulong)in_stack_ffffffffffffeb38 >> 0x20),(char *)this_05);
    testing::internal::AssertHelper::operator=(this_01,(Message *)assertion_result);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_04);
    std::__cxx11::string::~string(local_1138);
    testing::Message::~Message((Message *)0xd7d995);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd7da2c);
  local_114c = 0;
  local_1160 = HashtableTest<google::HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
               ::UniqueKey(this_05,iVar6);
  this_03 = (AssertHelper *)
            google::
            BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
            ::count(this_04,(key_type *)CONCAT44(uVar4,uVar3));
  local_1158 = this_03;
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            (in_stack_ffffffffffffeb38,(char *)this_05,(uint *)CONCAT44(iVar6,uVar5),
             (unsigned_long *)this_04);
  line = (int)((ulong)in_stack_ffffffffffffeb38 >> 0x20);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1148);
  if (!bVar1) {
    testing::Message::Message((Message *)this_03);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0xd7daf9);
    type = (Type)((ulong)pcVar2 >> 0x20);
    testing::internal::AssertHelper::AssertHelper
              (this_03,type,in_stack_ffffffffffffeb40,line,(char *)this_05);
    testing::internal::AssertHelper::operator=(this_01,(Message *)assertion_result);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_04);
    testing::Message::~Message((Message *)0xd7db56);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd7dbc7);
  file = HashtableTest<google::HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
         ::UniqueKey(this_05,iVar6);
  local_11b8 = file;
  google::
  BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::equal_range(this_00,key);
  this_06 = &local_88;
  std::
  pair<google::BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>::const_iterator,_google::BaseHashtableInterface<google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>::const_iterator>
  ::operator=(this_06,&local_11b0);
  local_11c9 = google::
               dense_hashtable_const_iterator<const_char_*,_const_char_*,_Hasher,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
               ::operator==((dense_hashtable_const_iterator<const_char_*,_const_char_*,_Hasher,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
                             *)this_06,&local_88.second.super_const_iterator);
  iVar6 = (int)((ulong)this_06 >> 0x20);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)this_04,(bool *)CONCAT44(uVar4,uVar3),(type *)0xd7dc58);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_11c8);
  if (!bVar1) {
    testing::Message::Message((Message *)this_03);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (assertion_result,expression_text,actual_predicate_value,in_stack_ffffffffffffeb80);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper(this_03,type,file,iVar6,(char *)this_05);
    testing::internal::AssertHelper::operator=(this_01,(Message *)assertion_result);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_04);
    std::__cxx11::string::~string(local_1200);
    testing::Message::~Message((Message *)0xd7dd2d);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xd7ddc1);
  google::
  HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  ::~HashtableInterface_DenseHashSet
            ((HashtableInterface_DenseHashSet<const_char_*,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
              *)0xd7ddce);
  return;
}

Assistant:

TYPED_TEST(HashtableAllTest, FindAndCountAndEqualRange) {
  pair<typename TypeParam::iterator, typename TypeParam::iterator> eq_pair;
  pair<typename TypeParam::const_iterator, typename TypeParam::const_iterator>
      const_eq_pair;

  EXPECT_TRUE(this->ht_.empty());
  EXPECT_TRUE(this->ht_.find(this->UniqueKey(1)) == this->ht_.end());
  EXPECT_EQ(0u, this->ht_.count(this->UniqueKey(1)));
  eq_pair = this->ht_.equal_range(this->UniqueKey(1));
  EXPECT_TRUE(eq_pair.first == eq_pair.second);

  this->ht_.insert(this->UniqueObject(1));
  EXPECT_FALSE(this->ht_.empty());
  this->ht_.insert(this->UniqueObject(11));
  this->ht_.insert(this->UniqueObject(111));
  this->ht_.insert(this->UniqueObject(1111));
  this->ht_.insert(this->UniqueObject(11111));
  this->ht_.insert(this->UniqueObject(111111));
  this->ht_.insert(this->UniqueObject(1111111));
  this->ht_.insert(this->UniqueObject(11111111));
  this->ht_.insert(this->UniqueObject(111111111));
  EXPECT_EQ(9u, this->ht_.size());
  typename TypeParam::const_iterator it = this->ht_.find(this->UniqueKey(1));
  EXPECT_EQ(it.key(), this->UniqueKey(1));

  // Allow testing the const version of the methods as well.
  const TypeParam ht = this->ht_;

  // Some successful lookups (via find, count, and equal_range).
  EXPECT_TRUE(this->ht_.find(this->UniqueKey(1)) != this->ht_.end());
  EXPECT_EQ(1u, this->ht_.count(this->UniqueKey(1)));
  eq_pair = this->ht_.equal_range(this->UniqueKey(1));
  EXPECT_TRUE(eq_pair.first != eq_pair.second);
  EXPECT_EQ(eq_pair.first.key(), this->UniqueKey(1));
  ++eq_pair.first;
  EXPECT_TRUE(eq_pair.first == eq_pair.second);

  EXPECT_TRUE(ht.find(this->UniqueKey(1)) != ht.end());
  EXPECT_EQ(1u, ht.count(this->UniqueKey(1)));
  const_eq_pair = ht.equal_range(this->UniqueKey(1));
  EXPECT_TRUE(const_eq_pair.first != const_eq_pair.second);
  EXPECT_EQ(const_eq_pair.first.key(), this->UniqueKey(1));
  ++const_eq_pair.first;
  EXPECT_TRUE(const_eq_pair.first == const_eq_pair.second);

  EXPECT_TRUE(this->ht_.find(this->UniqueKey(11111)) != this->ht_.end());
  EXPECT_EQ(1u, this->ht_.count(this->UniqueKey(11111)));
  eq_pair = this->ht_.equal_range(this->UniqueKey(11111));
  EXPECT_TRUE(eq_pair.first != eq_pair.second);
  EXPECT_EQ(eq_pair.first.key(), this->UniqueKey(11111));
  ++eq_pair.first;
  EXPECT_TRUE(eq_pair.first == eq_pair.second);

  EXPECT_TRUE(ht.find(this->UniqueKey(11111)) != ht.end());
  EXPECT_EQ(1u, ht.count(this->UniqueKey(11111)));
  const_eq_pair = ht.equal_range(this->UniqueKey(11111));
  EXPECT_TRUE(const_eq_pair.first != const_eq_pair.second);
  EXPECT_EQ(const_eq_pair.first.key(), this->UniqueKey(11111));
  ++const_eq_pair.first;
  EXPECT_TRUE(const_eq_pair.first == const_eq_pair.second);

  // Some unsuccessful lookups (via find, count, and equal_range).
  EXPECT_TRUE(this->ht_.find(this->UniqueKey(11112)) == this->ht_.end());
  EXPECT_EQ(0u, this->ht_.count(this->UniqueKey(11112)));
  eq_pair = this->ht_.equal_range(this->UniqueKey(11112));
  EXPECT_TRUE(eq_pair.first == eq_pair.second);

  EXPECT_TRUE(ht.find(this->UniqueKey(11112)) == ht.end());
  EXPECT_EQ(0u, ht.count(this->UniqueKey(11112)));
  const_eq_pair = ht.equal_range(this->UniqueKey(11112));
  EXPECT_TRUE(const_eq_pair.first == const_eq_pair.second);

  EXPECT_TRUE(this->ht_.find(this->UniqueKey(11110)) == this->ht_.end());
  EXPECT_EQ(0u, this->ht_.count(this->UniqueKey(11110)));
  eq_pair = this->ht_.equal_range(this->UniqueKey(11110));
  EXPECT_TRUE(eq_pair.first == eq_pair.second);

  EXPECT_TRUE(ht.find(this->UniqueKey(11110)) == ht.end());
  EXPECT_EQ(0u, ht.count(this->UniqueKey(11110)));
  const_eq_pair = ht.equal_range(this->UniqueKey(11110));
  EXPECT_TRUE(const_eq_pair.first == const_eq_pair.second);
}